

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O3

int main(void)

{
  char *pcVar1;
  char cVar2;
  int *piVar3;
  long lVar4;
  ostream *poVar5;
  undefined8 uVar6;
  int a;
  int iVar7;
  double dVar8;
  int local_5c;
  char *local_58;
  char local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter two numbers a and b:\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"a: ",3);
  readNumber_abi_cxx11_();
  pcVar1 = (char *)CONCAT71(uStack_4f,local_50);
  piVar3 = __errno_location();
  iVar7 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(pcVar1,&local_58,10);
  if (local_58 == pcVar1) {
    std::__throw_invalid_argument("stoi");
LAB_00104d2b:
    std::__throw_out_of_range("stoi");
  }
  else {
    a = (int)lVar4;
    if ((a != lVar4) || (*piVar3 == 0x22)) goto LAB_00104d2b;
    if (*piVar3 == 0) {
      *piVar3 = iVar7;
    }
    if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
      operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"b: ",3);
    readNumber_abi_cxx11_();
    pcVar1 = (char *)CONCAT71(uStack_4f,local_50);
    local_5c = *piVar3;
    *piVar3 = 0;
    lVar4 = strtol(pcVar1,&local_58,10);
    if (local_58 != pcVar1) {
      if ((0xfffffffeffffffff < lVar4 - 0x80000000U) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = local_5c;
        }
        if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
          operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
        }
        cVar2 = promptCalculationType();
        iVar7 = (int)lVar4;
        if (cVar2 == 'P') {
          dVar8 = permutations(a,iVar7);
        }
        else {
          dVar8 = combinations(a,iVar7);
        }
        local_50 = cVar2;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,&local_50,1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") = ",4);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)dVar8);
        local_50 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_50,1);
        return 0;
      }
      goto LAB_00104d43;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00104d43:
  uVar6 = std::__throw_out_of_range("stoi");
  if (*piVar3 == 0) {
    *piVar3 = local_5c;
  }
  main_cold_1();
  _Unwind_Resume(uVar6);
}

Assistant:

int main()
{
	int32_t a = 0;
	int32_t b = 0;
	std::cout << "Enter two numbers a and b:\n"
			  << "a: ";
	a = std::stoi(readNumber());
	std::cout << "b: ";
	b = std::stoi(readNumber());

	auto answer = promptCalculationType();
	int32_t result = 0;
	if (answer == 'P')
		result = permutations(a, b);
	else
		result = combinations(a, b);
	std::cout << answer << "(" << a << ", " << b << ") = " << result << '\n';
	return 0;
}